

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial.cpp
# Opt level: O2

void __thiscall create::Serial::~Serial(Serial *this)

{
  this->_vptr_Serial = (_func_int **)&PTR___cxa_pure_virtual_001686a8;
  disconnect(this);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->data).super___shared_ptr<create::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::_Function_base::~_Function_base(&(this->callback).super__Function_base);
  std::condition_variable::~condition_variable(&this->dataReadyCond);
  std::thread::~thread(&this->ioThread);
  boost::asio::detail::
  io_object_impl<boost::asio::detail::reactive_serial_port_service,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::~io_object_impl(&(this->port).impl_);
  boost::asio::detail::
  io_object_impl<boost::asio::detail::signal_set_service,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::~io_object_impl(&(this->signals).impl_);
  boost::asio::execution_context::~execution_context(&(this->io).super_execution_context);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            (&(this->super_enable_shared_from_this<create::Serial>)._M_weak_this.
              super___weak_ptr<create::Serial,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

Serial::~Serial() {
    disconnect();
  }